

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O2

void demo1(void)

{
  ostream *poVar1;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_4b8;
  Param local_4a0;
  IMLE imleObj;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Default constructor: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::IMLE(&imleObj,1,1,0x800);
  IMLE::Param::Param(&local_4a0,1,1);
  local_4b8.m_rows.m_value = 1;
  local_4b8.m_functor.m_other = 0.1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&local_4a0.Psi0,&local_4b8);
  local_4a0.sigma0 = 1.0;
  local_4a0.p0 = 0.2;
  local_4a0.multiValuedSignificance = 0.9;
  IMLE::setParameters(&imleObj,&local_4a0);
  cos1D_train<IMLE>(&imleObj,2000);
  cos1D_predict<IMLE>(&imleObj);
  IMLE::Param::~Param(&local_4a0);
  IMLE::~IMLE(&imleObj);
  return;
}

Assistant:

void demo1()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    // Default constructor:
    cout << "\t --- Default constructor: ---" << endl;
    IMLE imleObj(d,D);

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;
    param.multiValuedSignificance = 0.9;

    imleObj.setParameters(param);

    cos1D_train(imleObj);
    cos1D_predict(imleObj);
}